

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  long lVar1;
  ulong uVar2;
  uintptr_t uVar3;
  undefined8 *puVar4;
  upb_Arena *puVar5;
  upb_MemBlock *block;
  ulong uVar6;
  
  if (n != 0) {
    uVar6 = (long)mem + 7U & 0xfffffffffffffff8;
    uVar2 = 0;
    if (uVar6 - (long)mem <= n) {
      uVar2 = n - (uVar6 - (long)mem);
    }
    if (0x37 < uVar2) {
      puVar5 = (upb_Arena *)(uVar6 + (uVar2 & 0xfffffffffffffff8) + -0x38);
      lVar1 = uVar6 + (uVar2 & 0xfffffffffffffff8);
      *(undefined8 *)(lVar1 + -0x20) = 3;
      *(undefined8 *)(lVar1 + -0x18) = 0;
      *(uintptr_t **)(lVar1 + -0x10) = (uintptr_t *)(lVar1 + -0x28);
      *(undefined8 *)(lVar1 + -8) = 0;
      uVar3 = _upb_Arena_MakeBlockAlloc(alloc,true);
      *(uintptr_t *)(lVar1 + -0x28) = uVar3;
      *(ulong *)(lVar1 + -0x38) = uVar6;
      *(upb_Arena **)(lVar1 + -0x30) = puVar5;
      return puVar5;
    }
  }
  puVar5 = (upb_Arena *)0x0;
  if ((alloc != (upb_alloc *)0x0) &&
     (puVar4 = (undefined8 *)(*alloc->func)(alloc,(void *)0x0,0,0x148), puVar4 != (undefined8 *)0x0)
     ) {
    puVar5 = (upb_Arena *)(puVar4 + 0x22);
    uVar3 = _upb_Arena_MakeBlockAlloc(alloc,false);
    puVar4[0x24] = uVar3;
    puVar4[0x25] = 3;
    puVar4[0x26] = 0;
    puVar4[0x27] = puVar4 + 0x24;
    puVar4[0x28] = 0;
    *(undefined4 *)(puVar4 + 1) = 0x110;
    *puVar4 = puVar4[0x28];
    puVar4[0x28] = puVar4;
    puVar4[0x22] = puVar4 + 2;
    puVar4[0x23] = puVar5;
  }
  return puVar5;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (n) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_UP((uintptr_t)mem, UPB_MALLOC_ALIGN);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }

  /* Round block size down to alignof(*a) since we will allocate the arena
   * itself at the end. */
  n = UPB_ALIGN_DOWN(n, UPB_ALIGN_OF(upb_ArenaState));

  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState))) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena* ret = _upb_Arena_InitSlow(alloc);
    upb_Arena_LogInit(ret, n);
    return ret;
#else
    return _upb_Arena_InitSlow(alloc);
#endif
  }

  a = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), upb_ArenaState);

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.tail, &a->body);
  upb_Atomic_Init(&a->body.blocks, NULL);

  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = mem;
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), char);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}